

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

path * __thiscall ghc::filesystem::path::operator+=(path *this,value_type *x)

{
  path *ppVar1;
  allocator<char> local_39;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  value_type *local_18;
  value_type *x_local;
  path *this_local;
  
  local_18 = x;
  x_local = (value_type *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,x,&local_39);
  ppVar1 = concat<std::__cxx11::string>(this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  return ppVar1;
}

Assistant:

GHC_INLINE path& path::operator+=(const value_type* x)
{
    return concat(string_type(x));
}